

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastSR1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  ulong *puVar3;
  SerialArena *this;
  __int_type_conflict3 _Var4;
  __pointer_type pSVar5;
  char cVar6;
  uint uVar7;
  long lVar8;
  Rep *pRVar9;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar10;
  string *s;
  char *pcVar11;
  string *psVar12;
  uint uVar13;
  ParseContext *ctx_00;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *this_00;
  ulong uVar14;
  ulong uVar15;
  uint *puVar16;
  ushort *puVar17;
  pair<const_char_*,_int> pVar18;
  LogMessageFatal local_40 [16];
  
  if (data.field_0._0_1_ != '\0') {
    pcVar11 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar11;
  }
  this_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
            ((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this_00 & 7) != 0) {
    AlignFail(this_00);
  }
  bVar1 = *ptr;
  uVar7 = CONCAT31(0,bVar1);
  puVar3 = (ulong *)this_00[2].data;
  if (puVar3 != (ulong *)0x0) {
    lVar8 = __tls_get_addr(&PTR_004be9d0);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(lVar8 + 8))->data;
    if (data.field_0.data == (anon_union_8_1_898a9ca8_for_TcFieldData_0)*puVar3) {
      this = *(SerialArena **)(lVar8 + 0x10);
      data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)this_00->data;
      if (((ulong)data.field_0 & 1) == 0) {
        uVar13 = (uint)(data.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x0);
      }
      else {
        pRVar9 = RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)this_00);
        uVar13 = pRVar9->allocated_size;
      }
      if (uVar13 == *(uint *)(this_00 + 1)) {
        do {
          bVar2 = *(byte *)((long)ptr + 1);
          puVar17 = (ushort *)(ulong)bVar2;
          uVar13 = (uint)bVar2;
          if ((char)bVar2 < '\0') {
            pVar18 = ReadSizeFallback((char *)((long)ptr + 1),(uint)bVar2);
            ctx_00 = pVar18._8_8_;
            if ((ushort *)pVar18.first == (ushort *)0x0) goto LAB_00294407;
            uVar13 = pVar18.second;
            puVar17 = (ushort *)pVar18.first;
          }
          else {
            puVar17 = (ushort *)((long)ptr + 2);
          }
          _Var4 = (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
          if (_Var4 == 0) {
            data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                           SerialArena::AllocateFromStringBlockFallback(this);
          }
          else {
            uVar15 = _Var4 - 0x20;
            (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i = uVar15;
            pSVar5 = (this->string_block_)._M_b._M_p;
            uVar14 = (ulong)pSVar5->allocated_size_ - 0x10;
            if (uVar14 < uVar15) {
              psVar12 = absl::lts_20240722::log_internal::
                        MakeCheckOpString<unsigned_long,unsigned_long>
                                  (uVar15,uVar14,"offset <= effective_size()");
              absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                        (local_40,
                         "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/string_block.h"
                         ,0xa2,*(undefined8 *)(psVar12 + 8),*(undefined8 *)psVar12);
              absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
            }
            data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                           ((long)&pSVar5[-1].next_ + _Var4);
          }
          *(uint64_t *)data.field_0 = (long)data.field_0 + 0x10;
          *(undefined8 *)((long)data.field_0 + 8) = 0;
          *(undefined1 *)((long)data.field_0 + 0x10) = 0;
          RepeatedPtrFieldBase::AddAllocatedForParse
                    ((RepeatedPtrFieldBase *)this_00,(void *)data.field_0);
          ptr = EpsCopyInputStream::ReadString
                          (&ctx->super_EpsCopyInputStream,(char *)puVar17,uVar13,
                           (string *)data.field_0);
          ctx_00 = extraout_RDX;
          if ((ushort *)ptr == (ushort *)0x0) goto LAB_00294407;
          pVVar10 = RepeatedPtrFieldBase::
                    Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                              ((RepeatedPtrFieldBase *)this_00,*(int *)(this_00 + 1) + -1);
          cVar6 = utf8_range::IsStructurallyValid
                            (pVVar10->_M_string_length,(pVVar10->_M_dataplus)._M_p);
          if (cVar6 == '\0') {
            ReportFastUtf8Error(uVar7,table);
          }
          puVar17 = (ushort *)(ctx->super_EpsCopyInputStream).limit_end_;
          if (puVar17 <= ptr) goto LAB_002943cf;
          data.field_0.data._4_4_ = 0;
          data.field_0.data._0_4_ = uVar7;
        } while ((byte)*(ushort *)ptr == bVar1);
        goto LAB_00294385;
      }
    }
  }
  do {
    puVar17 = (ushort *)((long)ptr + 1);
    s = (string *)RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)this_00);
    ptr = InlineGreedyStringParser(s,(char *)puVar17,ctx);
    ctx_00 = extraout_RDX_00;
    if ((ushort *)ptr == (ushort *)0x0) {
LAB_00294407:
      pcVar11 = Error(msg,(char *)puVar17,ctx_00,data,table,hasbits);
      return pcVar11;
    }
    pVVar10 = RepeatedPtrFieldBase::
              Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                        ((RepeatedPtrFieldBase *)this_00,*(int *)(this_00 + 1) + -1);
    cVar6 = utf8_range::IsStructurallyValid(pVVar10->_M_string_length,(pVVar10->_M_dataplus)._M_p);
    if (cVar6 == '\0') {
      ReportFastUtf8Error(uVar7,table);
    }
    puVar17 = (ushort *)(ctx->super_EpsCopyInputStream).limit_end_;
    if (puVar17 <= ptr) goto LAB_002943cf;
    data.field_0.data._4_4_ = 0;
    data.field_0.data._0_4_ = uVar7;
  } while ((byte)*(ushort *)ptr == bVar1);
LAB_00294385:
  if (ptr < puVar17) {
    uVar7 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
    if ((uVar7 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    uVar14 = (ulong)(uVar7 & 0xfffffff8);
    pcVar11 = (char *)(**(code **)(&table[1].has_bits_offset + uVar14))
                                (msg,ptr,ctx,
                                 (ulong)*(ushort *)ptr ^
                                 *(ulong *)(&table[1].fast_idx_mask + uVar14 * 2),table,hasbits);
    return pcVar11;
  }
LAB_002943cf:
  if ((ulong)table->has_bits_offset != 0) {
    puVar16 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar16 & 3) != 0) {
      AlignFail();
    }
    *puVar16 = *puVar16 | (uint)hasbits;
  }
  return (char *)(ushort *)ptr;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastSR1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedString<
      uint8_t, RepeatedPtrField<std::string>, kUtf8ValidateOnly>(
      PROTOBUF_TC_PARAM_PASS);
}